

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise.cpp
# Opt level: O0

int __thiscall
ncnn::Eltwise::forward
          (Eltwise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  size_type sVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  int i_7;
  float *outptr_7;
  float *ptr_7;
  int q_7;
  Mat *bottom_blob1_7;
  size_t b_3;
  int i_6;
  float *outptr_6;
  float *ptr1_3;
  float *ptr_6;
  int q_6;
  Mat *bottom_blob1_6;
  int i_5;
  float *outptr_5;
  float *ptr_5;
  int q_5;
  float coeff;
  Mat *bottom_blob1_5;
  size_t b_2;
  int i_4;
  float *outptr_4;
  float *ptr1_2;
  float *ptr_4;
  int q_4;
  float coeff1;
  float coeff0;
  Mat *bottom_blob1_4;
  int i_3;
  float *outptr_3;
  float *ptr_3;
  int q_3;
  Mat *bottom_blob1_3;
  size_t b_1;
  int i_2;
  float *outptr_2;
  float *ptr1_1;
  float *ptr_2;
  int q_2;
  Mat *bottom_blob1_2;
  int i_1;
  float *outptr_1;
  float *ptr_1;
  int q_1;
  Mat *bottom_blob1_1;
  size_t b;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  Mat *bottom_blob1;
  Mat *top_blob;
  int size;
  int channels;
  int h;
  int w;
  Mat *bottom_blob;
  Mat *in_stack_fffffffffffff720;
  Allocator *in_stack_fffffffffffff730;
  Mat *in_stack_fffffffffffff738;
  ulong uVar4;
  Mat *in_stack_fffffffffffff740;
  int _c;
  Mat *in_stack_fffffffffffff748;
  int local_77c;
  Mat local_778;
  float *local_730;
  Mat local_728;
  float *local_6e0;
  int local_6d4;
  const_reference local_6d0;
  ulong local_6c8;
  int local_6bc;
  Mat local_6b8;
  Mat *local_670;
  Mat local_668;
  float *local_620;
  Mat local_618;
  float *local_5d0;
  int local_5c4;
  const_reference local_5c0;
  int local_5b4;
  Mat local_5b0;
  float *local_568;
  Mat local_560;
  float *local_518;
  int local_510;
  float local_50c;
  const_reference local_508;
  ulong local_500;
  int local_4f4;
  Mat local_4f0;
  float *local_4a8;
  Mat local_4a0;
  float *local_458;
  Mat local_450;
  float *local_408;
  int local_3fc;
  float local_3f8;
  float local_3f4;
  const_reference local_3f0;
  int local_3e4;
  Mat local_3e0;
  float *local_398;
  Mat local_390;
  float *local_348;
  int local_33c;
  const_reference local_338;
  ulong local_330;
  int local_324;
  Mat local_320;
  float *local_2d8;
  Mat local_2d0;
  float *local_288;
  Mat local_280;
  float *local_238;
  int local_22c;
  const_reference local_228;
  int local_21c;
  Mat local_218;
  float *local_1d0;
  Mat local_1c8;
  float *local_180;
  int local_174;
  const_reference local_170;
  ulong local_168;
  int local_15c;
  Mat local_158;
  float *local_110;
  Mat local_108;
  float *local_c0;
  Mat local_a8;
  float *local_60;
  int local_54;
  const_reference local_50;
  reference local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_34 = local_30->w;
  local_38 = local_30->h;
  local_3c = local_30->c;
  local_40 = local_34 * local_38;
  local_48 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  ncnn::Mat::create_like
            (in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff720);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0xd0) == 0) {
      local_50 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
      for (local_54 = 0; local_54 < local_3c; local_54 = local_54 + 1) {
        ncnn::Mat::channel(in_stack_fffffffffffff748,(int)((ulong)in_stack_fffffffffffff740 >> 0x20)
                          );
        pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_a8);
        ncnn::Mat::~Mat((Mat *)0x37d11f);
        local_60 = pfVar2;
        ncnn::Mat::channel(in_stack_fffffffffffff748,(int)((ulong)in_stack_fffffffffffff740 >> 0x20)
                          );
        pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_108);
        ncnn::Mat::~Mat((Mat *)0x37d177);
        local_c0 = pfVar2;
        ncnn::Mat::channel(in_stack_fffffffffffff748,(int)((ulong)in_stack_fffffffffffff740 >> 0x20)
                          );
        pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_158);
        ncnn::Mat::~Mat((Mat *)0x37d1cf);
        for (local_15c = 0; local_15c < local_40; local_15c = local_15c + 1) {
          pfVar2[local_15c] = local_60[local_15c] * local_c0[local_15c];
        }
        local_110 = pfVar2;
      }
      for (local_168 = 2; uVar4 = local_168,
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18), uVar4 < sVar3;
          local_168 = local_168 + 1) {
        local_170 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_18,local_168);
        for (local_174 = 0; local_174 < local_3c; local_174 = local_174 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff748,
                             (int)((ulong)in_stack_fffffffffffff740 >> 0x20));
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_1c8);
          ncnn::Mat::~Mat((Mat *)0x37d39b);
          local_180 = pfVar2;
          ncnn::Mat::channel(in_stack_fffffffffffff748,
                             (int)((ulong)in_stack_fffffffffffff740 >> 0x20));
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_218);
          ncnn::Mat::~Mat((Mat *)0x37d3f3);
          for (local_21c = 0; local_21c < local_40; local_21c = local_21c + 1) {
            pfVar2[local_21c] = local_180[local_21c] * pfVar2[local_21c];
          }
          local_1d0 = pfVar2;
        }
      }
    }
    else if (*(int *)(in_RDI + 0xd0) == 1) {
      if (*(int *)(in_RDI + 0x104) == 0) {
        local_228 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
        for (local_22c = 0; local_22c < local_3c; local_22c = local_22c + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff748,
                             (int)((ulong)in_stack_fffffffffffff740 >> 0x20));
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_280);
          ncnn::Mat::~Mat((Mat *)0x37d593);
          local_238 = pfVar2;
          ncnn::Mat::channel(in_stack_fffffffffffff748,
                             (int)((ulong)in_stack_fffffffffffff740 >> 0x20));
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_2d0);
          ncnn::Mat::~Mat((Mat *)0x37d5eb);
          local_288 = pfVar2;
          ncnn::Mat::channel(in_stack_fffffffffffff748,
                             (int)((ulong)in_stack_fffffffffffff740 >> 0x20));
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_320);
          ncnn::Mat::~Mat((Mat *)0x37d643);
          for (local_324 = 0; local_324 < local_40; local_324 = local_324 + 1) {
            pfVar2[local_324] = local_238[local_324] + local_288[local_324];
          }
          local_2d8 = pfVar2;
        }
        for (local_330 = 2; uVar4 = local_330,
            sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18),
            uVar4 < sVar3; local_330 = local_330 + 1) {
          local_338 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_18,local_330);
          for (local_33c = 0; local_33c < local_3c; local_33c = local_33c + 1) {
            ncnn::Mat::channel(in_stack_fffffffffffff748,
                               (int)((ulong)in_stack_fffffffffffff740 >> 0x20));
            pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_390);
            ncnn::Mat::~Mat((Mat *)0x37d80f);
            local_348 = pfVar2;
            ncnn::Mat::channel(in_stack_fffffffffffff748,
                               (int)((ulong)in_stack_fffffffffffff740 >> 0x20));
            pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_3e0);
            ncnn::Mat::~Mat((Mat *)0x37d867);
            for (local_3e4 = 0; local_3e4 < local_40; local_3e4 = local_3e4 + 1) {
              pfVar2[local_3e4] = local_348[local_3e4] + pfVar2[local_3e4];
            }
            local_398 = pfVar2;
          }
        }
      }
      else {
        local_3f0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
        pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),0);
        local_3f4 = *pfVar2;
        pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),1);
        local_3f8 = *pfVar2;
        for (local_3fc = 0; local_3fc < local_3c; local_3fc = local_3fc + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff748,
                             (int)((ulong)in_stack_fffffffffffff740 >> 0x20));
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_450);
          ncnn::Mat::~Mat((Mat *)0x37da28);
          local_408 = pfVar2;
          ncnn::Mat::channel(in_stack_fffffffffffff748,
                             (int)((ulong)in_stack_fffffffffffff740 >> 0x20));
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_4a0);
          ncnn::Mat::~Mat((Mat *)0x37da80);
          local_458 = pfVar2;
          ncnn::Mat::channel(in_stack_fffffffffffff748,
                             (int)((ulong)in_stack_fffffffffffff740 >> 0x20));
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_4f0);
          ncnn::Mat::~Mat((Mat *)0x37dad8);
          for (local_4f4 = 0; local_4f4 < local_40; local_4f4 = local_4f4 + 1) {
            pfVar2[local_4f4] = local_408[local_4f4] * local_3f4 + local_458[local_4f4] * local_3f8;
          }
          local_4a8 = pfVar2;
        }
        for (local_500 = 2; uVar4 = local_500,
            sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18),
            uVar4 < sVar3; local_500 = local_500 + 1) {
          local_508 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_18,local_500);
          pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),local_500);
          local_50c = *pfVar2;
          for (local_510 = 0; local_510 < local_3c; local_510 = local_510 + 1) {
            ncnn::Mat::channel(in_stack_fffffffffffff748,
                               (int)((ulong)in_stack_fffffffffffff740 >> 0x20));
            pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_560);
            ncnn::Mat::~Mat((Mat *)0x37dcd4);
            local_518 = pfVar2;
            ncnn::Mat::channel(in_stack_fffffffffffff748,
                               (int)((ulong)in_stack_fffffffffffff740 >> 0x20));
            pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_5b0);
            ncnn::Mat::~Mat((Mat *)0x37dd20);
            for (local_5b4 = 0; local_5b4 < local_40; local_5b4 = local_5b4 + 1) {
              pfVar2[local_5b4] = local_518[local_5b4] * local_50c + pfVar2[local_5b4];
            }
            local_568 = pfVar2;
          }
        }
      }
    }
    else if (*(int *)(in_RDI + 0xd0) == 2) {
      local_5c0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
      for (local_5c4 = 0; _c = (int)((ulong)in_stack_fffffffffffff740 >> 0x20), local_5c4 < local_3c
          ; local_5c4 = local_5c4 + 1) {
        ncnn::Mat::channel(in_stack_fffffffffffff748,_c);
        pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_618);
        ncnn::Mat::~Mat((Mat *)0x37deaa);
        local_5d0 = pfVar2;
        ncnn::Mat::channel(in_stack_fffffffffffff748,_c);
        pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_668);
        ncnn::Mat::~Mat((Mat *)0x37def6);
        in_stack_fffffffffffff740 = &local_6b8;
        local_620 = pfVar2;
        ncnn::Mat::channel(in_stack_fffffffffffff748,(int)((ulong)in_stack_fffffffffffff740 >> 0x20)
                          );
        in_stack_fffffffffffff748 =
             (Mat *)ncnn::Mat::operator_cast_to_float_(in_stack_fffffffffffff740);
        ncnn::Mat::~Mat((Mat *)0x37df42);
        local_670 = in_stack_fffffffffffff748;
        for (local_6bc = 0; local_6bc < local_40; local_6bc = local_6bc + 1) {
          pfVar2 = std::max<float>(local_5d0 + local_6bc,local_620 + local_6bc);
          *(float *)((long)&local_670->data + (long)local_6bc * 4) = *pfVar2;
        }
      }
      local_6c8 = 2;
      while (uVar4 = local_6c8,
            sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18),
            uVar4 < sVar3) {
        local_6d0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_18,local_6c8);
        for (local_6d4 = 0; local_6d4 < local_3c; local_6d4 = local_6d4 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff748,
                             (int)((ulong)in_stack_fffffffffffff740 >> 0x20));
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_728);
          ncnn::Mat::~Mat((Mat *)0x37e109);
          local_6e0 = pfVar2;
          ncnn::Mat::channel(in_stack_fffffffffffff748,
                             (int)((ulong)in_stack_fffffffffffff740 >> 0x20));
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_778);
          ncnn::Mat::~Mat((Mat *)0x37e153);
          local_730 = pfVar2;
          for (local_77c = 0; local_77c < local_40; local_77c = local_77c + 1) {
            pfVar2 = std::max<float>(local_730 + local_77c,local_6e0 + local_77c);
            local_730[local_77c] = *pfVar2;
          }
        }
        local_6c8 = local_6c8 + 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Eltwise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] * ptr1[i];
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] *= ptr[i];
                }
            }
        }
    }
    else if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = ptr[i] + ptr1[i];
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] += ptr[i];
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = ptr[i] * coeff0 + ptr1[i] * coeff1;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] += ptr[i] * coeff;
                    }
                }
            }
        }
    }
    else if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(ptr[i], ptr1[i]);
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], ptr[i]);
                }
            }
        }
    }

    return 0;
}